

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_base.h
# Opt level: O2

void __thiscall
FFT::BaseComplexData<kiss_fft_cpx>::resize
          (BaseComplexData<kiss_fft_cpx> *this,uint32_t width_,uint32_t height_)

{
  if (this->_width == width_) {
    if (height_ == 0) {
      return;
    }
    if (width_ == 0) {
      return;
    }
    if (this->_height == height_) {
      return;
    }
  }
  else if (height_ == 0 || width_ == 0) {
    return;
  }
  _clean(this);
  (*this->_vptr_BaseComplexData[2])(this,(ulong)(height_ * width_) << 3);
  this->_width = width_;
  this->_height = height_;
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if ( (_width != width_ || _height != height_) && width_ != 0 && height_ != 0 )
            {
                _clean();

                const uint32_t size = width_ * height_;
                _allocateData( size * sizeof( DataType ) );

                _width = width_;
                _height = height_;
            }
        }